

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::try_lock
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  bool bVar1;
  system_error *this_00;
  error_code eVar2;
  error_code __ec;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lk;
  id tid;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> *this_local;
  
  lk._M_device = (mutex_type *)std::this_thread::get_id();
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mtx_);
  bVar1 = std::operator==((id)(this->e_owner_)._M_thread,(id)lk._M_device);
  if ((!bVar1) && (bVar1 = is_shared_owner(this,(id)lk._M_device), !bVar1)) {
    bVar1 = rwlock::ReaderPrefer::wait_wlock(&this->state_);
    if (!bVar1) {
      rwlock::ReaderPrefer::acquire_wlock(&this->state_);
      (this->e_owner_)._M_thread = (native_handle_type)lk._M_device;
      validator::deadlock::locked((uintptr_t)this,(id)lk._M_device,false);
    }
    this_local._7_1_ = !bVar1;
    std::lock_guard<std::mutex>::~lock_guard(&local_28);
    return this_local._7_1_;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  eVar2 = std::make_error_code(resource_deadlock_would_occur);
  __ec._M_cat = eVar2._M_cat;
  __ec._4_4_ = 0;
  __ec._M_value = eVar2._M_value;
  std::system_error::system_error(this_00,__ec,"recursive try_lock");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

bool try_lock()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive try_lock");
#endif
    }
    if (RwLockPolicy::wait_wlock(state_))
      return false;
    RwLockPolicy::acquire_wlock(state_);
    e_owner_ = tid;
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }